

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CounterUnitTest.cpp
# Opt level: O0

bool TestComparisonsF<Counter<unsigned_int,24u>>(void)

{
  Counter<unsigned_int,_24U> CVar1;
  Counter<unsigned_int,_24U> local_650;
  Counter<unsigned_int,_24U> local_64c;
  Counter<unsigned_int,_24U> local_648;
  Counter<unsigned_int,_24U> local_644;
  Counter<unsigned_int,_24U> local_640;
  Counter<unsigned_int,_24U> local_63c;
  Counter<unsigned_int,_24U> local_638;
  Counter<unsigned_int,_24U> local_634;
  Counter<unsigned_int,_24U> local_630;
  Counter<unsigned_int,_24U> local_62c;
  Counter<unsigned_int,_24U> local_628;
  Counter<unsigned_int,_24U> local_624;
  Counter<unsigned_int,_24U> local_620;
  Counter<unsigned_int,_24U> local_61c;
  Counter<unsigned_int,_24U> local_618;
  Counter<unsigned_int,_24U> local_614;
  Counter<unsigned_int,_24U> local_610;
  Counter<unsigned_int,_24U> local_60c;
  Counter<unsigned_int,_24U> local_608;
  Counter<unsigned_int,_24U> local_604;
  Counter<unsigned_int,_24U> local_600;
  Counter<unsigned_int,_24U> local_5fc;
  Counter<unsigned_int,_24U> local_5f8;
  Counter<unsigned_int,_24U> local_5f4;
  Counter<unsigned_int,_24U> local_5f0;
  Counter<unsigned_int,_24U> local_5ec;
  Counter<unsigned_int,_24U> local_5e8;
  Counter<unsigned_int,_24U> local_5e4;
  Counter<unsigned_int,_24U> local_5e0;
  uint local_5dc;
  Counter<unsigned_int,_24U> local_5d8;
  uint ii_1;
  Counter<unsigned_int,_24U> local_5d0;
  Counter<unsigned_int,_24U> local_5cc;
  Counter<unsigned_int,_24U> local_5c8;
  Counter<unsigned_int,_24U> local_5c4;
  Counter<unsigned_int,_24U> local_5c0;
  Counter<unsigned_int,_24U> local_5bc;
  Counter<unsigned_int,_24U> local_5b8;
  Counter<unsigned_int,_24U> local_5b4;
  Counter<unsigned_int,_24U> local_5b0;
  Counter<unsigned_int,_24U> local_5ac;
  Counter<unsigned_int,_24U> local_5a8;
  Counter<unsigned_int,_24U> local_5a4;
  Counter<unsigned_int,_24U> local_5a0;
  Counter<unsigned_int,_24U> local_59c;
  Counter<unsigned_int,_24U> local_598;
  Counter<unsigned_int,_24U> local_594;
  Counter<unsigned_int,_24U> local_590;
  Counter<unsigned_int,_24U> local_58c;
  Counter<unsigned_int,_24U> local_588;
  Counter<unsigned_int,_24U> local_584;
  Counter<unsigned_int,_24U> local_580;
  Counter<unsigned_int,_24U> local_57c;
  Counter<unsigned_int,_24U> local_578;
  Counter<unsigned_int,_24U> local_574;
  Counter<unsigned_int,_24U> local_570;
  Counter<unsigned_int,_24U> local_56c;
  Counter<unsigned_int,_24U> local_568;
  uint local_564;
  uint local_560;
  uint ii;
  uint sep;
  Counter<unsigned_int,_24U> local_554;
  Counter<unsigned_int,_24U> local_550;
  Counter<unsigned_int,_24U> local_54c;
  Counter<unsigned_int,_24U> local_548;
  Counter<unsigned_int,_24U> local_544;
  Counter<unsigned_int,_24U> c;
  Counter<unsigned_int,_24U> b;
  Counter<unsigned_int,_24U> a;
  uint d_20;
  uint d_19;
  uint d_18;
  uint d_2;
  uint d_1;
  uint d;
  uint d_26;
  uint d_25;
  uint d_24;
  uint d_23;
  uint d_22;
  uint d_21;
  uint d_8;
  uint d_7;
  uint d_6;
  uint d_5;
  uint d_4;
  uint d_3;
  uint d_29;
  uint d_28;
  uint d_27;
  uint d_11;
  uint d_10;
  uint d_9;
  uint d_35;
  uint d_34;
  uint d_33;
  uint d_32;
  uint d_31;
  uint d_30;
  uint d_17;
  uint d_16;
  uint d_15;
  uint d_14;
  uint d_13;
  uint d_12;
  uint oldValue_1;
  uint oldValue;
  uint oldValue_3;
  uint oldValue_2;
  
  Counter<unsigned_int,_24U>::Counter(&c,2);
  Counter<unsigned_int,_24U>::Counter(&local_544,2);
  Counter<unsigned_int,_24U>::Counter(&local_548,3);
  Counter<unsigned_int,_24U>::Counter(&local_54c,&local_544);
  if (c.Value == local_54c.Value) {
    Counter<unsigned_int,_24U>::Counter(&local_550,&local_548);
    if (local_544.Value == local_550.Value) {
      b.Value._3_1_ = false;
    }
    else {
      Counter<unsigned_int,_24U>::Counter(&local_554,&local_548);
      Counter<unsigned_int,_24U>::operator=(&local_544,&local_554);
      Counter<unsigned_int,_24U>::Counter((Counter<unsigned_int,_24U> *)&sep,&local_548);
      if (local_544.Value == sep) {
        Counter<unsigned_int,_24U>::Counter((Counter<unsigned_int,_24U> *)&ii,&local_544);
        if (c.Value == ii) {
          b.Value._3_1_ = false;
        }
        else {
          for (local_560 = 0; local_560 < 3; local_560 = local_560 + 1) {
            Counter<unsigned_int,_24U>::operator=(&c,0xffffff - local_560);
            Counter<unsigned_int,_24U>::operator=(&local_544,0);
            Counter<unsigned_int,_24U>::operator=(&local_548,local_560 + 1);
            for (local_564 = 0; local_564 < 1000; local_564 = local_564 + 1) {
              Counter<unsigned_int,_24U>::Counter(&local_568,&c);
              if (c.Value != local_568.Value) {
                return false;
              }
              Counter<unsigned_int,_24U>::Counter(&local_56c,&local_544);
              if (local_544.Value != local_56c.Value) {
                return false;
              }
              Counter<unsigned_int,_24U>::Counter(&local_570,&local_548);
              if (local_548.Value != local_570.Value) {
                return false;
              }
              Counter<unsigned_int,_24U>::Counter(&local_574,&local_544);
              if (c.Value == local_574.Value) {
                return false;
              }
              Counter<unsigned_int,_24U>::Counter(&local_578,&local_548);
              if (c.Value == local_578.Value) {
                return false;
              }
              Counter<unsigned_int,_24U>::Counter(&local_57c,&c);
              if (local_544.Value == local_57c.Value) {
                return false;
              }
              Counter<unsigned_int,_24U>::Counter(&local_580,&local_548);
              if (local_544.Value == local_580.Value) {
                return false;
              }
              Counter<unsigned_int,_24U>::Counter(&local_584,&c);
              if (local_548.Value == local_584.Value) {
                return false;
              }
              Counter<unsigned_int,_24U>::Counter(&local_588,&local_544);
              if (local_548.Value == local_588.Value) {
                return false;
              }
              Counter<unsigned_int,_24U>::Counter(&local_58c,&local_544);
              if ((c.Value - local_58c.Value & 0xffffff) < 0x800000) {
                return false;
              }
              Counter<unsigned_int,_24U>::Counter(&local_590,&local_548);
              if ((c.Value - local_590.Value & 0xffffff) < 0x800000) {
                return false;
              }
              Counter<unsigned_int,_24U>::Counter(&local_594,&local_548);
              if ((local_544.Value - local_594.Value & 0xffffff) < 0x800000) {
                return false;
              }
              Counter<unsigned_int,_24U>::Counter(&local_598,&local_544);
              if (0x7fffff < (local_598.Value - c.Value & 0xffffff)) {
                return false;
              }
              Counter<unsigned_int,_24U>::Counter(&local_59c,&local_548);
              if (0x7fffff < (local_59c.Value - c.Value & 0xffffff)) {
                return false;
              }
              Counter<unsigned_int,_24U>::Counter(&local_5a0,&local_548);
              if (0x7fffff < (local_5a0.Value - local_544.Value & 0xffffff)) {
                return false;
              }
              Counter<unsigned_int,_24U>::Counter(&local_5a4,&c);
              if (0x7fffff < (local_5a4.Value - c.Value & 0xffffff)) {
                return false;
              }
              Counter<unsigned_int,_24U>::Counter(&local_5a8,&local_544);
              if (0x7fffff < (local_5a8.Value - local_544.Value & 0xffffff)) {
                return false;
              }
              Counter<unsigned_int,_24U>::Counter(&local_5ac,&local_548);
              if (0x7fffff < (local_5ac.Value - local_548.Value & 0xffffff)) {
                return false;
              }
              Counter<unsigned_int,_24U>::Counter(&local_5b0,&c);
              if ((local_5b0.Value - local_544.Value & 0xffffff) < 0x800000) {
                return false;
              }
              Counter<unsigned_int,_24U>::Counter(&local_5b4,&c);
              if ((local_5b4.Value - local_548.Value & 0xffffff) < 0x800000) {
                return false;
              }
              Counter<unsigned_int,_24U>::Counter(&local_5b8,&local_544);
              if ((local_5b8.Value - local_548.Value & 0xffffff) < 0x800000) {
                return false;
              }
              Counter<unsigned_int,_24U>::Counter(&local_5bc,&c);
              if (0x7fffff < (local_544.Value - local_5bc.Value & 0xffffff)) {
                return false;
              }
              Counter<unsigned_int,_24U>::Counter(&local_5c0,&c);
              if (0x7fffff < (local_548.Value - local_5c0.Value & 0xffffff)) {
                return false;
              }
              Counter<unsigned_int,_24U>::Counter(&local_5c4,&local_544);
              if (0x7fffff < (local_548.Value - local_5c4.Value & 0xffffff)) {
                return false;
              }
              Counter<unsigned_int,_24U>::Counter(&local_5c8,&c);
              if (0x7fffff < (c.Value - local_5c8.Value & 0xffffff)) {
                return false;
              }
              Counter<unsigned_int,_24U>::Counter(&local_5cc,&local_544);
              if (0x7fffff < (local_544.Value - local_5cc.Value & 0xffffff)) {
                return false;
              }
              Counter<unsigned_int,_24U>::Counter(&local_5d0,&local_548);
              CVar1 = c;
              if (0x7fffff < (local_548.Value - local_5d0.Value & 0xffffff)) {
                return false;
              }
              c.Value = c.Value + 1 & 0xffffff;
              Counter<unsigned_int,_24U>::Counter((Counter<unsigned_int,_24U> *)&ii_1,CVar1.Value);
              CVar1.Value = local_548.Value;
              local_544.Value = local_544.Value + 1 & 0xffffff;
              local_548.Value = local_548.Value + 1 & 0xffffff;
              Counter<unsigned_int,_24U>::Counter(&local_5d8,CVar1.Value);
            }
            for (local_5dc = 0; local_5dc < 2000; local_5dc = local_5dc + 1) {
              Counter<unsigned_int,_24U>::Counter(&local_5e0,&c);
              if (c.Value != local_5e0.Value) {
                return false;
              }
              Counter<unsigned_int,_24U>::Counter(&local_5e4,&local_544);
              if (local_544.Value != local_5e4.Value) {
                return false;
              }
              Counter<unsigned_int,_24U>::Counter(&local_5e8,&local_548);
              if (local_548.Value != local_5e8.Value) {
                return false;
              }
              Counter<unsigned_int,_24U>::Counter(&local_5ec,&local_544);
              if (c.Value == local_5ec.Value) {
                return false;
              }
              Counter<unsigned_int,_24U>::Counter(&local_5f0,&local_548);
              if (c.Value == local_5f0.Value) {
                return false;
              }
              Counter<unsigned_int,_24U>::Counter(&local_5f4,&c);
              if (local_544.Value == local_5f4.Value) {
                return false;
              }
              Counter<unsigned_int,_24U>::Counter(&local_5f8,&local_548);
              if (local_544.Value == local_5f8.Value) {
                return false;
              }
              Counter<unsigned_int,_24U>::Counter(&local_5fc,&c);
              if (local_548.Value == local_5fc.Value) {
                return false;
              }
              Counter<unsigned_int,_24U>::Counter(&local_600,&local_544);
              if (local_548.Value == local_600.Value) {
                return false;
              }
              Counter<unsigned_int,_24U>::Counter(&local_604,&local_544);
              if ((c.Value - local_604.Value & 0xffffff) < 0x800000) {
                return false;
              }
              Counter<unsigned_int,_24U>::Counter(&local_608,&local_548);
              if ((c.Value - local_608.Value & 0xffffff) < 0x800000) {
                return false;
              }
              Counter<unsigned_int,_24U>::Counter(&local_60c,&local_548);
              if ((local_544.Value - local_60c.Value & 0xffffff) < 0x800000) {
                return false;
              }
              Counter<unsigned_int,_24U>::Counter(&local_610,&local_544);
              if (0x7fffff < (local_610.Value - c.Value & 0xffffff)) {
                return false;
              }
              Counter<unsigned_int,_24U>::Counter(&local_614,&local_548);
              if (0x7fffff < (local_614.Value - c.Value & 0xffffff)) {
                return false;
              }
              Counter<unsigned_int,_24U>::Counter(&local_618,&local_548);
              if (0x7fffff < (local_618.Value - local_544.Value & 0xffffff)) {
                return false;
              }
              Counter<unsigned_int,_24U>::Counter(&local_61c,&c);
              if (0x7fffff < (local_61c.Value - c.Value & 0xffffff)) {
                return false;
              }
              Counter<unsigned_int,_24U>::Counter(&local_620,&local_544);
              if (0x7fffff < (local_620.Value - local_544.Value & 0xffffff)) {
                return false;
              }
              Counter<unsigned_int,_24U>::Counter(&local_624,&local_548);
              if (0x7fffff < (local_624.Value - local_548.Value & 0xffffff)) {
                return false;
              }
              Counter<unsigned_int,_24U>::Counter(&local_628,&c);
              if ((local_628.Value - local_544.Value & 0xffffff) < 0x800000) {
                return false;
              }
              Counter<unsigned_int,_24U>::Counter(&local_62c,&c);
              if ((local_62c.Value - local_548.Value & 0xffffff) < 0x800000) {
                return false;
              }
              Counter<unsigned_int,_24U>::Counter(&local_630,&local_544);
              if ((local_630.Value - local_548.Value & 0xffffff) < 0x800000) {
                return false;
              }
              Counter<unsigned_int,_24U>::Counter(&local_634,&c);
              if (0x7fffff < (local_544.Value - local_634.Value & 0xffffff)) {
                return false;
              }
              Counter<unsigned_int,_24U>::Counter(&local_638,&c);
              if (0x7fffff < (local_548.Value - local_638.Value & 0xffffff)) {
                return false;
              }
              Counter<unsigned_int,_24U>::Counter(&local_63c,&local_544);
              if (0x7fffff < (local_548.Value - local_63c.Value & 0xffffff)) {
                return false;
              }
              Counter<unsigned_int,_24U>::Counter(&local_640,&c);
              if (0x7fffff < (c.Value - local_640.Value & 0xffffff)) {
                return false;
              }
              Counter<unsigned_int,_24U>::Counter(&local_644,&local_544);
              if (0x7fffff < (local_544.Value - local_644.Value & 0xffffff)) {
                return false;
              }
              Counter<unsigned_int,_24U>::Counter(&local_648,&local_548);
              CVar1 = c;
              if (0x7fffff < (local_548.Value - local_648.Value & 0xffffff)) {
                return false;
              }
              c.Value = c.Value - 1 & 0xffffff;
              Counter<unsigned_int,_24U>::Counter(&local_64c,CVar1.Value);
              CVar1.Value = local_548.Value;
              local_544.Value = local_544.Value - 1 & 0xffffff;
              local_548.Value = local_548.Value - 1 & 0xffffff;
              Counter<unsigned_int,_24U>::Counter(&local_650,CVar1.Value);
            }
          }
          b.Value._3_1_ = true;
        }
      }
      else {
        b.Value._3_1_ = false;
      }
    }
  }
  else {
    b.Value._3_1_ = false;
  }
  return b.Value._3_1_;
}

Assistant:

bool TestComparisonsF()
{
    CounterT a = 2, b = 2, c = 3;
    TEST_CHECK(a == b);
    TEST_CHECK(b != c);
    b = c;
    TEST_CHECK(b == c);
    TEST_CHECK(a != b);

    for (unsigned sep = 0; sep < 3; ++sep)
    {
        a = CounterT::kMask - sep;
        b = 0;
        c = 1 + sep;

        for (unsigned ii = 0; ii < 1000; ++ii)
        {
            TEST_CHECK(a == a);
            TEST_CHECK(b == b);
            TEST_CHECK(c == c);
            TEST_CHECK(a != b);
            TEST_CHECK(a != c);
            TEST_CHECK(b != a);
            TEST_CHECK(b != c);
            TEST_CHECK(c != a);
            TEST_CHECK(c != b);

            TEST_CHECK(a < b);
            TEST_CHECK(a < c);
            TEST_CHECK(b < c);
            TEST_CHECK(a <= b);
            TEST_CHECK(a <= c);
            TEST_CHECK(b <= c);
            TEST_CHECK(a <= a);
            TEST_CHECK(b <= b);
            TEST_CHECK(c <= c);

            TEST_CHECK(b > a);
            TEST_CHECK(c > a);
            TEST_CHECK(c > b);
            TEST_CHECK(b >= a);
            TEST_CHECK(c >= a);
            TEST_CHECK(c >= b);
            TEST_CHECK(a >= a);
            TEST_CHECK(b >= b);
            TEST_CHECK(c >= c);

            a++;
            ++b;
            c++;
        }

        for (unsigned ii = 0; ii < 2000; ++ii)
        {
            TEST_CHECK(a == a);
            TEST_CHECK(b == b);
            TEST_CHECK(c == c);
            TEST_CHECK(a != b);
            TEST_CHECK(a != c);
            TEST_CHECK(b != a);
            TEST_CHECK(b != c);
            TEST_CHECK(c != a);
            TEST_CHECK(c != b);

            TEST_CHECK(a < b);
            TEST_CHECK(a < c);
            TEST_CHECK(b < c);
            TEST_CHECK(a <= b);
            TEST_CHECK(a <= c);
            TEST_CHECK(b <= c);
            TEST_CHECK(a <= a);
            TEST_CHECK(b <= b);
            TEST_CHECK(c <= c);

            TEST_CHECK(b > a);
            TEST_CHECK(c > a);
            TEST_CHECK(c > b);
            TEST_CHECK(b >= a);
            TEST_CHECK(c >= a);
            TEST_CHECK(c >= b);
            TEST_CHECK(a >= a);
            TEST_CHECK(b >= b);
            TEST_CHECK(c >= c);

            a--;
            --b;
            c--;
        }
    }

    return true;
}